

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDrawTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::anon_unknown_0::AttributeGroup::init
          (AttributeGroup *this,EVP_PKEY_CTX *ctx)

{
  int *piVar1;
  InputType IVar2;
  OutputType OVar3;
  TestContext *pTVar4;
  pointer this_00;
  int extraout_EAX;
  DrawTest *pDVar5;
  RenderContext *pRVar6;
  reference pvVar7;
  char *description;
  OutputType type;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  undefined8 extraout_RDX_00;
  string local_220;
  string local_200;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  string desc;
  InputType IStack_158;
  int ioNdx;
  IOPair iopairs [2];
  undefined1 local_138 [8];
  DrawTestSpec spec_2;
  DrawTest *test_2;
  undefined1 local_d8 [8];
  DrawTestSpec spec_1;
  DrawTest *test_1;
  undefined1 local_78 [8];
  DrawTestSpec spec;
  DrawTest *test;
  AttributeGroup *this_local;
  
  pDVar5 = (DrawTest *)operator_new(0x138);
  pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar6 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  deqp::gls::DrawTest::DrawTest(pDVar5,pTVar4,pRVar6,"single_attribute","Single attribute array.");
  deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_78);
  local_78._0_4_ = glu::ApiType::es(2,0);
  local_78._4_4_ = this->m_primitive;
  spec.apiType.m_bits = 0;
  spec.primitive = this->m_method;
  spec.primitiveCount = this->m_indexType;
  spec.drawMethod = DRAWMETHOD_DRAWARRAYS;
  spec.indexType = this->m_indexStorage;
  spec.indexPointerOffset = 0;
  spec.indexStorage = STORAGE_USER;
  spec.first = 0;
  spec.indexMin = 1;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
            *)&spec.baseVertex,1);
  piVar1 = &spec.baseVertex;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->inputType = INPUTTYPE_FLOAT;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->outputType = OUTPUTTYPE_VEC2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->storage = STORAGE_BUFFER;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->usage = USAGE_STATIC_DRAW;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->componentCount = 2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->offset = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->stride = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->normalize = false;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->instanceDivisor = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->useDefaultAttribute = false;
  addTestIterations(pDVar5,(DrawTestSpec *)local_78,TYPE_DRAW_COUNT);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar5);
  deqp::gls::DrawTestSpec::~DrawTestSpec((DrawTestSpec *)local_78);
  pDVar5 = (DrawTest *)operator_new(0x138);
  pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar6 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  deqp::gls::DrawTest::DrawTest
            (pDVar5,pTVar4,pRVar6,"multiple_attributes","Multiple attribute arrays");
  spec_1.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pDVar5;
  deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_d8);
  local_d8._0_4_ = glu::ApiType::es(2,0);
  local_d8._4_4_ = this->m_primitive;
  spec_1.apiType.m_bits = 0;
  spec_1.primitive = this->m_method;
  spec_1.primitiveCount = this->m_indexType;
  spec_1.drawMethod = DRAWMETHOD_DRAWARRAYS;
  spec_1.indexType = this->m_indexStorage;
  spec_1.indexPointerOffset = 0;
  spec_1.indexStorage = STORAGE_USER;
  spec_1.first = 0;
  spec_1.indexMin = 1;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
            *)&spec_1.baseVertex,2);
  piVar1 = &spec_1.baseVertex;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->inputType = INPUTTYPE_FLOAT;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->outputType = OUTPUTTYPE_VEC2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->storage = STORAGE_BUFFER;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->usage = USAGE_STATIC_DRAW;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->componentCount = 4;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->offset = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->stride = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->normalize = false;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->instanceDivisor = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,0);
  pvVar7->useDefaultAttribute = false;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->inputType = INPUTTYPE_FLOAT;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->outputType = OUTPUTTYPE_VEC2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->storage = STORAGE_BUFFER;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->usage = USAGE_STATIC_DRAW;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->componentCount = 2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->offset = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->stride = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->normalize = false;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->instanceDivisor = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)piVar1,1);
  pvVar7->useDefaultAttribute = false;
  addTestIterations((DrawTest *)
                    spec_1.attribs.
                    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(DrawTestSpec *)local_d8,
                    TYPE_DRAW_COUNT);
  tcu::TestNode::addChild
            ((TestNode *)this,
             (TestNode *)
             spec_1.attribs.
             super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  deqp::gls::DrawTestSpec::~DrawTestSpec((DrawTestSpec *)local_d8);
  pDVar5 = (DrawTest *)operator_new(0x138);
  pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar6 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  deqp::gls::DrawTest::DrawTest
            (pDVar5,pTVar4,pRVar6,"default_attribute","Attribute specified with glVertexAttrib*.");
  spec_2.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pDVar5;
  deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_138);
  iopairs[1].componentCount = (int)glu::ApiType::es(2,0);
  local_138._4_4_ = this->m_primitive;
  spec_2.apiType.m_bits = 5;
  spec_2.primitive = this->m_method;
  spec_2.primitiveCount = this->m_indexType;
  spec_2.drawMethod = DRAWMETHOD_DRAWARRAYS;
  spec_2.indexType = this->m_indexStorage;
  spec_2.indexPointerOffset = 0;
  spec_2.indexStorage = STORAGE_USER;
  spec_2.first = 0;
  spec_2.indexMin = 1;
  local_138._0_4_ = iopairs[1].componentCount;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
            *)&spec_2.baseVertex,2);
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_2.baseVertex,0);
  pvVar7->inputType = INPUTTYPE_FLOAT;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_2.baseVertex,0);
  pvVar7->outputType = OUTPUTTYPE_VEC2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_2.baseVertex,0);
  pvVar7->storage = STORAGE_BUFFER;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_2.baseVertex,0);
  pvVar7->usage = USAGE_STATIC_DRAW;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_2.baseVertex,0);
  pvVar7->componentCount = 2;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_2.baseVertex,0);
  pvVar7->offset = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_2.baseVertex,0);
  pvVar7->stride = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_2.baseVertex,0);
  pvVar7->normalize = false;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_2.baseVertex,0);
  pvVar7->instanceDivisor = 0;
  pvVar7 = std::
           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec_2.baseVertex,0);
  pvVar7->useDefaultAttribute = false;
  _IStack_158 = 0x100000000;
  iopairs[0].input = INPUTTYPE_SHORT;
  iopairs[0].output = OUTPUTTYPE_FLOAT;
  iopairs[0].componentCount = 3;
  iopairs[1].input = INPUTTYPE_DOUBLE;
  uVar8 = extraout_RDX;
  for (desc.field_2._12_4_ = 0; (int)desc.field_2._12_4_ < 2;
      desc.field_2._12_4_ = desc.field_2._12_4_ + 1) {
    deqp::gls::DrawTestSpec::inputTypeToString_abi_cxx11_
              (&local_1e0,(DrawTestSpec *)(ulong)(&IStack_158)[(long)(int)desc.field_2._12_4_ * 3],
               (InputType)uVar8);
    de::toString<int>(&local_200,(int *)(iopairs + (int)desc.field_2._12_4_));
    std::operator+(&local_1c0,&local_1e0,&local_200);
    std::operator+(&local_1a0,&local_1c0," to ");
    deqp::gls::DrawTestSpec::outputTypeToString_abi_cxx11_
              (&local_220,
               (DrawTestSpec *)
               (ulong)(uint)iopairs[(long)(int)desc.field_2._12_4_ + -1].componentCount,type);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                   &local_1a0,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1e0);
    IVar2 = (&IStack_158)[(long)(int)desc.field_2._12_4_ * 3];
    piVar1 = &spec_2.baseVertex;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->inputType = IVar2;
    OVar3 = iopairs[(long)(int)desc.field_2._12_4_ + -1].componentCount;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->outputType = OVar3;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->storage = STORAGE_BUFFER;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->usage = USAGE_STATIC_DRAW;
    IVar2 = iopairs[(int)desc.field_2._12_4_].input;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->componentCount = IVar2;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->offset = 0;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->stride = 0;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->normalize = false;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    pvVar7->instanceDivisor = 0;
    pvVar7 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           *)piVar1,1);
    this_00 = spec_2.attribs.
              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar7->useDefaultAttribute = true;
    description = (char *)std::__cxx11::string::c_str();
    deqp::gls::DrawTest::addIteration((DrawTest *)this_00,(DrawTestSpec *)local_138,description);
    std::__cxx11::string::~string((string *)local_180);
    uVar8 = extraout_RDX_00;
  }
  tcu::TestNode::addChild
            ((TestNode *)this,
             (TestNode *)
             spec_2.attribs.
             super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  deqp::gls::DrawTestSpec::~DrawTestSpec((DrawTestSpec *)local_138);
  return extraout_EAX;
}

Assistant:

void AttributeGroup::init (void)
{
	// Single attribute
	{
		gls::DrawTest*		test				= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), "single_attribute", "Single attribute array.");
		gls::DrawTestSpec	spec;

		spec.apiType							= glu::ApiType::es(2,0);
		spec.primitive							= m_primitive;
		spec.primitiveCount						= 0;
		spec.drawMethod							= m_method;
		spec.indexType							= m_indexType;
		spec.indexPointerOffset					= 0;
		spec.indexStorage						= m_indexStorage;
		spec.first								= 0;
		spec.indexMin							= 0;
		spec.indexMax							= 0;
		spec.instanceCount						= 1;

		spec.attribs.resize(1);

		spec.attribs[0].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[0].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[0].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[0].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[0].componentCount			= 2;
		spec.attribs[0].offset					= 0;
		spec.attribs[0].stride					= 0;
		spec.attribs[0].normalize				= false;
		spec.attribs[0].instanceDivisor			= 0;
		spec.attribs[0].useDefaultAttribute		= false;

		addTestIterations(test, spec, TYPE_DRAW_COUNT);

		this->addChild(test);
	}

	// Multiple attribute
	{
		gls::DrawTest*		test				= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), "multiple_attributes", "Multiple attribute arrays");
		gls::DrawTestSpec	spec;

		spec.apiType							= glu::ApiType::es(2,0);
		spec.primitive							= m_primitive;
		spec.primitiveCount						= 0;
		spec.drawMethod							= m_method;
		spec.indexType							= m_indexType;
		spec.indexPointerOffset					= 0;
		spec.indexStorage						= m_indexStorage;
		spec.first								= 0;
		spec.indexMin							= 0;
		spec.indexMax							= 0;
		spec.instanceCount						= 1;

		spec.attribs.resize(2);

		spec.attribs[0].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[0].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[0].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[0].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[0].componentCount			= 4;
		spec.attribs[0].offset					= 0;
		spec.attribs[0].stride					= 0;
		spec.attribs[0].normalize				= false;
		spec.attribs[0].instanceDivisor			= 0;
		spec.attribs[0].useDefaultAttribute		= false;

		spec.attribs[1].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[1].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[1].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[1].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[1].componentCount			= 2;
		spec.attribs[1].offset					= 0;
		spec.attribs[1].stride					= 0;
		spec.attribs[1].normalize				= false;
		spec.attribs[1].instanceDivisor			= 0;
		spec.attribs[1].useDefaultAttribute		= false;

		addTestIterations(test, spec, TYPE_DRAW_COUNT);

		this->addChild(test);
	}

	// Multiple attribute, second one default.
	{
		gls::DrawTest*		test				= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), "default_attribute", "Attribute specified with glVertexAttrib*.");
		gls::DrawTestSpec	spec;

		spec.apiType							= glu::ApiType::es(2,0);
		spec.primitive							= m_primitive;
		spec.primitiveCount						= 5;
		spec.drawMethod							= m_method;
		spec.indexType							= m_indexType;
		spec.indexPointerOffset					= 0;
		spec.indexStorage						= m_indexStorage;
		spec.first								= 0;
		spec.indexMin							= 0;
		spec.indexMax							= 0;
		spec.instanceCount						= 1;

		spec.attribs.resize(2);

		spec.attribs[0].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[0].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[0].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[0].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[0].componentCount			= 2;
		spec.attribs[0].offset					= 0;
		spec.attribs[0].stride					= 0;
		spec.attribs[0].normalize				= false;
		spec.attribs[0].instanceDivisor			= 0;
		spec.attribs[0].useDefaultAttribute		= false;

		struct IOPair
		{
			gls::DrawTestSpec::InputType  input;
			gls::DrawTestSpec::OutputType output;
			int							  componentCount;
		} iopairs[] =
		{
			{ gls::DrawTestSpec::INPUTTYPE_FLOAT,        gls::DrawTestSpec::OUTPUTTYPE_VEC2,  4 },
			{ gls::DrawTestSpec::INPUTTYPE_FLOAT,        gls::DrawTestSpec::OUTPUTTYPE_VEC4,  2 },
		};

		for (int ioNdx = 0; ioNdx < DE_LENGTH_OF_ARRAY(iopairs); ++ioNdx)
		{
			const std::string desc = gls::DrawTestSpec::inputTypeToString(iopairs[ioNdx].input) + de::toString(iopairs[ioNdx].componentCount) + " to " + gls::DrawTestSpec::outputTypeToString(iopairs[ioNdx].output);

			spec.attribs[1].inputType			= iopairs[ioNdx].input;
			spec.attribs[1].outputType			= iopairs[ioNdx].output;
			spec.attribs[1].storage				= gls::DrawTestSpec::STORAGE_BUFFER;
			spec.attribs[1].usage				= gls::DrawTestSpec::USAGE_STATIC_DRAW;
			spec.attribs[1].componentCount		= iopairs[ioNdx].componentCount;
			spec.attribs[1].offset				= 0;
			spec.attribs[1].stride				= 0;
			spec.attribs[1].normalize			= false;
			spec.attribs[1].instanceDivisor		= 0;
			spec.attribs[1].useDefaultAttribute	= true;

			test->addIteration(spec, desc.c_str());
		}

		this->addChild(test);
	}
}